

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O3

bool __thiscall crnlib::dxt_image::flip_y(dxt_image *this)

{
  byte bVar1;
  element_type eVar2;
  uint uVar3;
  uint value;
  uint value_00;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint x;
  uint uVar9;
  uint h;
  bool bVar10;
  byte bVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  element tmp;
  dxt5_block local_60;
  uint local_58;
  uint local_54;
  dxt_image *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar15 = this->m_height, 4 < uVar15 && (uVar15 & 3) != 0)) {
    bVar10 = false;
  }
  else {
    bVar10 = true;
    if (uVar15 != 1) {
      uVar15 = this->m_blocks_y;
      uVar14 = uVar15 >> 1;
      if (1 < uVar15) {
        uVar9 = 0;
        do {
          flip_row(this,uVar9);
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
        uVar15 = this->m_blocks_y;
      }
      if ((uVar15 & 1) != 0) {
        local_58 = this->m_height;
        uVar15 = this->m_blocks_x;
        h = 4;
        if (local_58 < 4) {
          h = local_58;
        }
        if (uVar15 != 0) {
          uVar16 = (ulong)(h >> 1);
          local_48 = 0;
          local_50 = this;
          local_54 = uVar14;
          local_38 = uVar16;
          uVar3 = this->m_num_elements_per_block;
          do {
            uVar4 = (ulong)uVar3;
            uVar7 = 0;
            if (uVar3 != 0) {
              local_40 = 0;
              do {
                local_60 = *(dxt5_block *)
                            (this->m_pElements +
                            ((this->m_blocks_x * uVar14 + (int)local_48) * (int)uVar4 +
                            (int)local_40));
                eVar2 = this->m_element_type[local_40];
                if (eVar2 == cAlphaDXT5) {
                  dxt5_block::flip_y(&local_60,4,h);
                }
                else if (eVar2 == cAlphaDXT3) {
                  if (1 < local_58) {
                    uVar15 = 0;
                    do {
                      uVar9 = 0;
                      do {
                        value = dxt3_block::get_alpha((dxt3_block *)&local_60,uVar9,uVar15,false);
                        value_00 = dxt3_block::get_alpha
                                             ((dxt3_block *)&local_60,uVar9,~uVar15 + h,false);
                        dxt3_block::set_alpha((dxt3_block *)&local_60,uVar9,uVar15,value_00,false);
                        dxt3_block::set_alpha((dxt3_block *)&local_60,uVar9,~uVar15 + h,value,false)
                        ;
                        uVar9 = uVar9 + 1;
                      } while (uVar9 != 4);
                      uVar15 = uVar15 + 1;
                      uVar16 = local_38;
                    } while (uVar15 != (uint)local_38);
                  }
                }
                else if ((eVar2 == cColorDXT1) && (1 < local_58)) {
                  uVar4 = 0;
                  do {
                    uVar8 = (ulong)(~(uint)uVar4 + h);
                    bVar11 = local_60.m_selectors[uVar8 + 2];
                    iVar6 = 0;
                    do {
                      bVar1 = local_60.m_selectors[uVar4 + 2];
                      bVar5 = (byte)iVar6;
                      bVar13 = ~(byte)(3 << (bVar5 & 0x1f));
                      local_60.m_selectors[uVar4 + 2] =
                           (byte)((bVar11 >> (bVar5 & 0x1f) & 3) << (bVar5 & 0x1f)) | bVar1 & bVar13
                      ;
                      bVar11 = (byte)((bVar1 >> (bVar5 & 0x1f) & 3) << (bVar5 & 0x1f)) |
                               bVar13 & local_60.m_selectors[uVar8 + 2];
                      local_60.m_selectors[uVar8 + 2] = bVar11;
                      iVar6 = iVar6 + 2;
                    } while (iVar6 != 8);
                    uVar4 = uVar4 + 1;
                  } while (uVar4 != uVar16);
                }
                *(dxt5_block *)
                 (local_50->m_pElements +
                 ((local_50->m_blocks_x * local_54 + (int)local_48) *
                  local_50->m_num_elements_per_block + (int)local_40)) = local_60;
                local_40 = local_40 + 1;
                uVar7 = local_50->m_num_elements_per_block;
                uVar4 = (ulong)uVar7;
                this = local_50;
                uVar14 = local_54;
              } while (local_40 < uVar4);
              uVar15 = local_50->m_blocks_x;
            }
            uVar12 = (int)local_48 + 1;
            local_48 = (ulong)uVar12;
            uVar3 = uVar7;
          } while (uVar12 < uVar15);
          bVar10 = true;
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool dxt_image::flip_y() {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  if ((m_height & 3) && (m_height > 4))
    return false;

  if (m_height == 1)
    return true;

  const uint mid_y = m_blocks_y / 2;

  for (uint y = 0; y < mid_y; y++)
    flip_row(y);

  if (m_blocks_y & 1) {
    const uint h = math::minimum(m_height, 4U);
    for (uint x = 0; x < m_blocks_x; x++) {
      for (uint e = 0; e < get_elements_per_block(); e++) {
        element tmp(get_element(x, mid_y, e));
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp)->flip_y(4, h);
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp)->flip_y(4, h);
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp)->flip_y(4, h);
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
        get_element(x, mid_y, e) = tmp;
      }
    }
  }

  return true;
}